

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultWriteCordTest_WriteEmptyCordToArray_Test::
~DefaultWriteCordTest_WriteEmptyCordToArray_Test
          (DefaultWriteCordTest_WriteEmptyCordToArray_Test *this)

{
  DefaultWriteCordTest_WriteEmptyCordToArray_Test *this_local;
  
  ~DefaultWriteCordTest_WriteEmptyCordToArray_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DefaultWriteCordTest, WriteEmptyCordToArray) {
  absl::Cord source;
  std::string buffer = "abc";
  ArrayOutputStream output(&buffer[0], static_cast<int>(buffer.length()));
  EXPECT_TRUE(output.WriteCord(source));
  EXPECT_EQ(output.ByteCount(), source.size());
  EXPECT_EQ(buffer, "abc");
}